

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O2

void highwayhash::MeasureDurations(Func func,DurationsForInputs *input_map,uint8_t *arg)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  FuncInput FVar1;
  Item *pIVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  pointer puVar5;
  uint8_t *arg_00;
  Duration DVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  ThreadAffinity *affinity;
  ulong uVar12;
  size_t i_1;
  long lVar13;
  size_t i;
  ulong uVar14;
  pointer puVar15;
  code *pcVar16;
  mt19937_64 *in_stack_ffffffffffffed48;
  int *local_12b0;
  double local_12a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> distribution;
  uint local_1278;
  int local_1274;
  uint8_t *local_1270;
  DurationSamples samples;
  vector<int,_std::allocator<int>_> cpus;
  _Rb_tree_node_base *local_1210;
  Inputs inputs;
  mt19937_64 rng;
  
  local_1270 = arg;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&rng);
  if ((anonymous_namespace)::
      Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::resolution ==
      '\0') {
    iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)
                                 ::resolution);
    if (iVar8 != 0) {
      pcVar16 = anon_unknown_0::Func1;
      if (func != anon_unknown_0::Func2) {
        pcVar16 = anon_unknown_0::Func2;
      }
      samples.num_samples_ = 0;
      samples.samples_for_input_._M_t._M_impl._0_8_ = 0;
      samples.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      samples.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&samples,0x200);
      AvailableCPUs();
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)cpus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)cpus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
      affinity = GetThreadAffinity();
      for (local_12b0 = cpus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_12b0 !=
          cpus.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish; local_12b0 = local_12b0 + 1) {
        PinThreadToCPU(*local_12b0);
        for (uVar14 = 0; uVar14 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x200)) / auVar4,0);
            uVar14 = uVar14 + 1) {
          for (lVar13 = 0; lVar13 != 0x200; lVar13 = lVar13 + 1) {
            uVar12 = rdtsc();
            distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = (int)uVar12;
            local_1274 = (*pcVar16)(local_1270,lVar13,uVar12 >> 0x20);
            rdtscp();
            *(int *)((long)&inputs.unique_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar13 * 4) =
                 local_1274 -
                 (int)distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          CountingSort<unsigned_int>((uint *)&inputs,(uint *)&rng);
          local_1278 = Mode<unsigned_int>((uint *)&inputs,0x200);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&samples,&local_1278);
        }
      }
      SetThreadAffinity(affinity);
      free(affinity);
      sVar3 = samples.num_samples_;
      CountingSort<unsigned_int>
                ((uint *)samples.num_samples_,(uint *)samples.samples_for_input_._M_t._M_impl._0_8_)
      ;
      uVar9 = Mode<unsigned_int>((uint *)sVar3,
                                 (long)(samples.samples_for_input_._M_t._M_impl._0_8_ -
                                       samples.num_samples_) >> 2);
      printf("Resolution %lu\n",(ulong)uVar9);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&cpus.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&samples);
      (anonymous_namespace)::
      Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::resolution =
           uVar9;
      __cxa_guard_release(&(anonymous_namespace)::
                           Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)
                           ::resolution);
    }
  }
  uVar9 = (anonymous_namespace)::
          Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::resolution;
  uVar14 = (ulong)(anonymous_namespace)::
                  Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::
                  resolution;
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&distribution,input_map->inputs_
             ,input_map->inputs_ + input_map->num_inputs_,(allocator_type *)&inputs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&inputs.unique_,&distribution);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (inputs.unique_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
             inputs.unique_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (inputs.unique_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       inputs.unique_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            (&inputs.unique_,(const_iterator)__first._M_current,
             (const_iterator)
             inputs.unique_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  this = &inputs.replicas_;
  uVar14 = ((ulong)((long)distribution.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   CONCAT44(distribution.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)distribution.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start)) >> 3) * uVar14 * 400;
  inputs.replicas_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.replicas_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.replicas_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (this,((long)distribution.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     CONCAT44(distribution.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)distribution.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                    ((long)inputs.replicas_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)inputs.replicas_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3));
    puVar5 = distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar15 = (pointer)CONCAT44(distribution.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)distribution.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
        arg_00 = local_1270, puVar15 != puVar5; puVar15 = puVar15 + 1) {
      samples.num_samples_ = *puVar15;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (this,&samples.num_samples_);
    }
    DVar6 = anon_unknown_0::TotalDuration(uVar9,func,local_1270,this,&rng);
  } while (DVar6 <= uVar14 && uVar14 - DVar6 != 0);
  uVar14 = (long)inputs.replicas_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)inputs.replicas_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar12 = (long)distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           CONCAT44(distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                    (int)distribution.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  inputs.num_replicas_ = uVar14 / uVar12;
  local_12a0 = 1.0;
  if (inputs.num_replicas_ != 1) {
    printf("NumReplicas %zu\n",inputs.num_replicas_,uVar14 % uVar12);
    local_12a0 = (double)(int)inputs.num_replicas_;
  }
  anon_unknown_0::GatherDurationSamples
            (&samples,uVar9,&inputs,func,arg_00,(size_t)&rng,in_stack_ffffffffffffed48);
  for (p_Var10 = samples.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &samples.samples_for_input_._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    FVar1 = *(FuncInput *)(p_Var10 + 1);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (p_Var10[1]._M_parent,p_Var10[1]._M_left);
    uVar7 = Mode<unsigned_int>(&(p_Var10[1]._M_parent)->_M_color,
                               (long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent >> 2);
    pIVar2 = input_map->items;
    sVar3 = input_map->num_items;
    pIVar2[sVar3].input = FVar1;
    pIVar2[sVar3].num_durations = 1;
    *pIVar2[sVar3].durations = (float)((double)uVar7 * (1.0 / local_12a0));
    input_map->num_items = sVar3 + 1;
  }
  for (uVar14 = 1; uVar14 < input_map->max_durations_; uVar14 = uVar14 + 1) {
    anon_unknown_0::GatherDurationSamples
              ((DurationSamples *)&cpus,uVar9,&inputs,func,arg_00,(size_t)&rng,
               in_stack_ffffffffffffed48);
    for (p_Var11 = local_1210;
        p_Var11 !=
        (_Rb_tree_node_base *)
        &cpus.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage; p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      FVar1 = *(FuncInput *)(p_Var11 + 1);
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var11[1]._M_parent,p_Var11[1]._M_left);
      uVar7 = Mode<unsigned_int>(&(p_Var11[1]._M_parent)->_M_color,
                                 (long)p_Var11[1]._M_left - (long)p_Var11[1]._M_parent >> 2);
      DurationsForInputs::AddSample(input_map,FVar1,(float)((double)uVar7 * (1.0 / local_12a0)));
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&cpus.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&samples.samples_for_input_._M_t);
  anon_unknown_0::Inputs::~Inputs(&inputs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&distribution.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void MeasureDurations(const Func func, DurationsForInputs* input_map,
                      const uint8_t* arg) {
  std::mt19937_64 rng;
  const Duration resolution = Resolution(func, arg);

  // Adds enough 'replicas' of the distribution to measure "func" given
  // the timer resolution.
  const std::vector<FuncInput> distribution(
      input_map->inputs_, input_map->inputs_ + input_map->num_inputs_);
  Inputs inputs(resolution, distribution, func, arg, &rng);
  const double per_call = 1.0 / static_cast<int>(inputs.NumReplicas());

  // First iteration: populate input_map items.
  auto samples =
      GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
  samples.Reduce(
      [per_call, input_map](const FuncInput input, const Duration duration) {
        const float sample = static_cast<float>(duration * per_call);
        input_map->AddItem(input, sample);
      });

  // Subsequent iteration(s): append to input_map items' array.
  for (size_t rep = 1; rep < input_map->max_durations_; ++rep) {
    auto samples =
        GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
    samples.Reduce(
        [per_call, input_map](const FuncInput input, const Duration duration) {
          const float sample = static_cast<float>(duration * per_call);
          input_map->AddSample(input, sample);
        });
  }
}